

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerGLSL::builtin_to_glsl_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,BuiltIn builtin,StorageClass storage)

{
  bool bVar1;
  uint uVar2;
  char *pcVar3;
  SPIREntryPoint *pSVar4;
  CompilerError *pCVar5;
  byte bVar6;
  undefined4 in_register_0000000c;
  uint *ts_1;
  char *pcVar7;
  allocator local_39;
  string local_38;
  
  ts_1 = &switchD_0025f895::switchdataD_003761ac;
  switch(builtin) {
  case BuiltInPosition:
    pcVar7 = "gl_Position";
    break;
  case BuiltInPointSize:
    pcVar7 = "gl_PointSize";
    break;
  case 2:
  case BuiltInPatchVertices:
  case BuiltInSampleMask|BuiltInPointSize:
  case BuiltInWorkDim:
  case BuiltInGlobalSize:
  case BuiltInEnqueuedWorkgroupSize:
  case BuiltInGlobalOffset:
  case BuiltInGlobalLinearId:
  case BuiltInGlobalLinearId|BuiltInPointSize:
  case BuiltInSubgroupMaxSize:
  case BuiltInNumEnqueuedSubgroups:
switchD_0025f86b_caseD_1145:
    ::std::__cxx11::to_string(&local_38,builtin);
    join<char_const(&)[12],std::__cxx11::string>
              (__return_storage_ptr__,(spirv_cross *)"gl_BuiltIn_",(char (*) [12])&local_38,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ts_1);
    ::std::__cxx11::string::~string((string *)&local_38);
    return __return_storage_ptr__;
  case BuiltInClipDistance:
    pcVar7 = "gl_ClipDistance";
    break;
  case BuiltInCullDistance:
    pcVar7 = "gl_CullDistance";
    break;
  case BuiltInVertexId:
    if ((this->options).vulkan_semantics == true) {
      pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_38,
                 "Cannot implement gl_VertexID in Vulkan GLSL. This shader was created with GL semantics."
                 ,&local_39);
      CompilerError::CompilerError(pCVar5,&local_38);
      __cxa_throw(pCVar5,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    goto LAB_0025fe7d;
  case BuiltInInstanceId:
    if (((this->options).vulkan_semantics == true) &&
       (pSVar4 = Compiler::get_entry_point(&this->super_Compiler),
       2 < pSVar4->model - ExecutionModelIntersectionKHR)) {
      pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_38,
                 "Cannot implement gl_InstanceID in Vulkan GLSL. This shader was created with GL semantics."
                 ,&local_39);
      CompilerError::CompilerError(pCVar5,&local_38);
      __cxa_throw(pCVar5,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    if (((this->options).es == false) && ((this->options).version < 0x8c)) {
      ::std::__cxx11::string::string((string *)&local_38,"GL_ARB_draw_instanced",&local_39);
      require_extension_internal(this,&local_38);
      ::std::__cxx11::string::~string((string *)&local_38);
    }
    goto LAB_002602bc;
  case BuiltInPrimitiveId:
    if ((storage == StorageClassInput) &&
       (pSVar4 = Compiler::get_entry_point(&this->super_Compiler),
       pSVar4->model == ExecutionModelGeometry)) {
      pcVar7 = "gl_PrimitiveIDIn";
    }
    else {
      pcVar7 = "gl_PrimitiveID";
    }
    break;
  case BuiltInInvocationId:
    pcVar7 = "gl_InvocationID";
    break;
  case BuiltInLayer:
    pcVar7 = "gl_Layer";
    break;
  case BuiltInViewportIndex:
    pcVar7 = "gl_ViewportIndex";
    break;
  case BuiltInTessLevelOuter:
    pcVar7 = "gl_TessLevelOuter";
    break;
  case BuiltInTessLevelInner:
    pcVar7 = "gl_TessLevelInner";
    break;
  case BuiltInTessCoord:
    pcVar7 = "gl_TessCoord";
    break;
  case BuiltInFragCoord:
    pcVar7 = "gl_FragCoord";
    break;
  case BuiltInPointCoord:
    pcVar7 = "gl_PointCoord";
    break;
  case BuiltInFrontFacing:
    pcVar7 = "gl_FrontFacing";
    break;
  case BuiltInSampleId:
    bVar6 = (this->options).es;
    uVar2 = (this->options).version;
    if ((uVar2 < 0x140 & bVar6) == 1) {
      ::std::__cxx11::string::string((string *)&local_38,"GL_OES_sample_variables",&local_39);
      require_extension_internal(this,&local_38);
      ::std::__cxx11::string::~string((string *)&local_38);
      bVar6 = (this->options).es;
      uVar2 = (this->options).version;
    }
    if (((bVar6 & 1) == 0) && (uVar2 < 400)) {
      pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_38,"gl_SampleID not supported before GLSL 400.",&local_39);
      CompilerError::CompilerError(pCVar5,&local_38);
      __cxa_throw(pCVar5,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    pcVar7 = "gl_SampleID";
    break;
  case BuiltInSamplePosition:
    bVar6 = (this->options).es;
    uVar2 = (this->options).version;
    if ((uVar2 < 0x140 & bVar6) == 1) {
      ::std::__cxx11::string::string((string *)&local_38,"GL_OES_sample_variables",&local_39);
      require_extension_internal(this,&local_38);
      ::std::__cxx11::string::~string((string *)&local_38);
      bVar6 = (this->options).es;
      uVar2 = (this->options).version;
    }
    if (((bVar6 & 1) == 0) && (uVar2 < 400)) {
      pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_38,"gl_SamplePosition not supported before GLSL 400.",&local_39);
      CompilerError::CompilerError(pCVar5,&local_38);
      __cxa_throw(pCVar5,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    pcVar7 = "gl_SamplePosition";
    break;
  case BuiltInSampleMask:
    bVar6 = (this->options).es;
    uVar2 = (this->options).version;
    if ((uVar2 < 0x140 & bVar6) == 1) {
      ::std::__cxx11::string::string((string *)&local_38,"GL_OES_sample_variables",&local_39);
      require_extension_internal(this,&local_38);
      ::std::__cxx11::string::~string((string *)&local_38);
      bVar6 = (this->options).es;
      uVar2 = (this->options).version;
    }
    if (((bVar6 & 1) == 0) && (uVar2 < 400)) {
      pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_38,"gl_SampleMask/gl_SampleMaskIn not supported before GLSL 400.",
                 &local_39);
      CompilerError::CompilerError(pCVar5,&local_38);
      __cxa_throw(pCVar5,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    if (storage == StorageClassInput) {
      pcVar7 = "gl_SampleMaskIn";
    }
    else {
      pcVar7 = "gl_SampleMask";
    }
    break;
  case BuiltInFragDepth:
    pcVar7 = "gl_FragDepth";
    break;
  case BuiltInHelperInvocation:
    pcVar7 = "gl_HelperInvocation";
    break;
  case BuiltInNumWorkgroups:
    pcVar7 = "gl_NumWorkGroups";
    break;
  case BuiltInWorkgroupSize:
    pcVar7 = "gl_WorkGroupSize";
    break;
  case BuiltInWorkgroupId:
    pcVar7 = "gl_WorkGroupID";
    break;
  case BuiltInLocalInvocationId:
    pcVar7 = "gl_LocalInvocationID";
    break;
  case BuiltInGlobalInvocationId:
    pcVar7 = "gl_GlobalInvocationID";
    break;
  case BuiltInLocalInvocationIndex:
    pcVar7 = "gl_LocalInvocationIndex";
    break;
  case BuiltInSubgroupSize:
    request_subgroup_feature(this,SubgroupSize);
    pcVar7 = "gl_SubgroupSize";
    break;
  case BuiltInNumSubgroups:
    request_subgroup_feature(this,NumSubgroups);
    pcVar7 = "gl_NumSubgroups";
    break;
  case BuiltInSubgroupId:
    request_subgroup_feature(this,SubgroupID);
    pcVar7 = "gl_SubgroupID";
    break;
  case BuiltInSubgroupLocalInvocationId:
    request_subgroup_feature(this,SubgroupInvocationID);
    pcVar7 = "gl_SubgroupInvocationID";
    break;
  case BuiltInVertexIndex:
    if ((this->options).vulkan_semantics == true) {
      pcVar7 = "gl_VertexIndex";
      break;
    }
LAB_0025fe7d:
    pcVar7 = "gl_VertexID";
    break;
  case BuiltInInstanceIndex:
    if ((this->options).vulkan_semantics == true) {
      pcVar7 = "gl_InstanceIndex";
      break;
    }
    if (((this->options).es == false) && ((this->options).version < 0x8c)) {
      ::std::__cxx11::string::string((string *)&local_38,"GL_ARB_draw_instanced",&local_39);
      require_extension_internal(this,&local_38);
      ::std::__cxx11::string::~string((string *)&local_38);
    }
    if ((this->options).vertex.support_nonzero_base_instance == true) {
      if ((this->options).vulkan_semantics == false) {
        ::std::__cxx11::string::string
                  ((string *)&local_38,"GL_ARB_shader_draw_parameters",&local_39);
        require_extension_internal(this,&local_38);
        ::std::__cxx11::string::~string((string *)&local_38);
      }
      pcVar7 = "(gl_InstanceID + SPIRV_Cross_BaseInstance)";
      break;
    }
LAB_002602bc:
    pcVar7 = "gl_InstanceID";
    break;
  default:
    ts_1 = &switchD_0025f8b1::switchdataD_00376308;
    switch(builtin) {
    case BuiltInLaunchIdKHR:
      pcVar3 = "gl_LaunchIDEXT";
      pcVar7 = "gl_LaunchIDNV";
      break;
    case BuiltInLaunchSizeKHR:
      pcVar3 = "gl_LaunchSizeEXT";
      pcVar7 = "gl_LaunchSizeNV";
      break;
    case BuiltInWorldRayOriginKHR:
      pcVar3 = "gl_WorldRayOriginEXT";
      pcVar7 = "gl_WorldRayOriginNV";
      break;
    case BuiltInWorldRayDirectionKHR:
      pcVar3 = "gl_WorldRayDirectionEXT";
      pcVar7 = "gl_WorldRayDirectionNV";
      break;
    case BuiltInObjectRayOriginKHR:
      pcVar3 = "gl_ObjectRayOriginEXT";
      pcVar7 = "gl_ObjectRayOriginNV";
      break;
    case BuiltInObjectRayDirectionKHR:
      pcVar3 = "gl_ObjectRayDirectionEXT";
      pcVar7 = "gl_ObjectRayDirectionNV";
      break;
    case BuiltInRayTminKHR:
      pcVar3 = "gl_RayTminEXT";
      pcVar7 = "gl_RayTminNV";
      break;
    case BuiltInRayTmaxKHR:
      pcVar3 = "gl_RayTmaxEXT";
      pcVar7 = "gl_RayTmaxNV";
      break;
    case BuiltInInstanceCustomIndexKHR:
      pcVar3 = "gl_InstanceCustomIndexEXT";
      pcVar7 = "gl_InstanceCustomIndexNV";
      break;
    case 0x14d0:
    case 0x14d1:
    case BuiltInCurrentRayTimeNV:
    case BuiltInCurrentRayTimeNV|BuiltInPointSize:
    case 0x14d8:
    case 0x14d9:
    case 0x14da:
    case 0x14db:
    case 0x14dc:
    case 0x14dd:
    case 0x14de:
    case 0x14df:
    case 0x14e0:
    case 0x14e1:
    case 0x14e2:
    case 0x14e3:
    case 0x14e4:
    case 0x14e5:
    case 0x14e6:
      goto switchD_0025f86b_caseD_1145;
    case BuiltInObjectToWorldKHR:
      pcVar3 = "gl_ObjectToWorldEXT";
      pcVar7 = "gl_ObjectToWorldNV";
      break;
    case BuiltInWorldToObjectKHR:
      pcVar3 = "gl_WorldToObjectEXT";
      pcVar7 = "gl_WorldToObjectNV";
      break;
    case BuiltInHitTNV:
      pcVar7 = "gl_HitTNV";
      goto LAB_0025fac9;
    case BuiltInHitKindKHR:
      pcVar3 = "gl_HitKindEXT";
      pcVar7 = "gl_HitKindNV";
      break;
    case BuiltInIncomingRayFlagsKHR:
      pcVar3 = "gl_IncomingRayFlagsEXT";
      pcVar7 = "gl_IncomingRayFlagsNV";
      break;
    default:
      ts_1 = &switchD_0025f86b::switchdataD_0037625c;
      switch(builtin) {
      case BuiltInSubgroupEqMask:
        request_subgroup_feature(this,SubgroupMask);
        pcVar7 = "gl_SubgroupEqMask";
        break;
      case BuiltInSubgroupGeMask:
        request_subgroup_feature(this,SubgroupMask);
        pcVar7 = "gl_SubgroupGeMask";
        break;
      case BuiltInSubgroupGtMask:
        request_subgroup_feature(this,SubgroupMask);
        pcVar7 = "gl_SubgroupGtMask";
        break;
      case BuiltInSubgroupLeMask:
        request_subgroup_feature(this,SubgroupMask);
        pcVar7 = "gl_SubgroupLeMask";
        break;
      case BuiltInSubgroupLtMask:
        request_subgroup_feature(this,SubgroupMask);
        pcVar7 = "gl_SubgroupLtMask";
        break;
      case BuiltInSubgroupLtMask|BuiltInPointSize:
      case 0x1146:
      case BuiltInSubgroupLtMask|BuiltInClipDistance:
      case BuiltInDrawIndex|BuiltInPointSize:
      case BuiltInBaseVertex|BuiltInCullDistance:
      case BuiltInBaseVertex|BuiltInVertexId:
      case BuiltInBaseVertex|BuiltInInstanceId:
      case BuiltInBaseVertex|BuiltInPrimitiveId:
      case BuiltInPrimitiveShadingRateKHR|BuiltInPointSize:
      case 0x1152:
      case BuiltInPrimitiveShadingRateKHR|BuiltInClipDistance:
      case BuiltInPrimitiveShadingRateKHR|BuiltInCullDistance:
      case BuiltInPrimitiveShadingRateKHR|BuiltInVertexId:
      case BuiltInDeviceIndex|BuiltInPointSize:
      case BuiltInViewIndex|BuiltInPointSize:
      case 0x115a:
      case BuiltInViewIndex|BuiltInClipDistance:
        goto switchD_0025f86b_caseD_1145;
      case BuiltInBaseVertex:
        if ((this->options).es == true) {
          pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&local_38,"BaseVertex not supported in ES profile.",&local_39);
          CompilerError::CompilerError(pCVar5,&local_38);
          __cxa_throw(pCVar5,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        if ((this->options).vulkan_semantics == true) {
          if ((this->options).version < 0x1cc) {
            ::std::__cxx11::string::string
                      ((string *)&local_38,"GL_ARB_shader_draw_parameters",&local_39);
            require_extension_internal(this,&local_38);
            ::std::__cxx11::string::~string((string *)&local_38);
            pcVar7 = "gl_BaseVertexARB";
          }
          else {
            pcVar7 = "gl_BaseVertex";
          }
        }
        else {
          ::std::__cxx11::string::string
                    ((string *)&local_38,"GL_ARB_shader_draw_parameters",&local_39);
          require_extension_internal(this,&local_38);
          ::std::__cxx11::string::~string((string *)&local_38);
          pcVar7 = "SPIRV_Cross_BaseVertex";
        }
        break;
      case BuiltInBaseInstance:
        if ((this->options).es == true) {
          pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&local_38,"BaseInstance not supported in ES profile.",&local_39);
          CompilerError::CompilerError(pCVar5,&local_38);
          __cxa_throw(pCVar5,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        if ((this->options).vulkan_semantics == true) {
          if ((this->options).version < 0x1cc) {
            ::std::__cxx11::string::string
                      ((string *)&local_38,"GL_ARB_shader_draw_parameters",&local_39);
            require_extension_internal(this,&local_38);
            ::std::__cxx11::string::~string((string *)&local_38);
            pcVar7 = "gl_BaseInstanceARB";
          }
          else {
            pcVar7 = "gl_BaseInstance";
          }
        }
        else {
          ::std::__cxx11::string::string
                    ((string *)&local_38,"GL_ARB_shader_draw_parameters",&local_39);
          require_extension_internal(this,&local_38);
          ::std::__cxx11::string::~string((string *)&local_38);
          pcVar7 = "SPIRV_Cross_BaseInstance";
        }
        break;
      case BuiltInDrawIndex:
        if ((this->options).es == true) {
          pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&local_38,"DrawIndex not supported in ES profile.",&local_39);
          CompilerError::CompilerError(pCVar5,&local_38);
          __cxa_throw(pCVar5,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        if ((this->options).vulkan_semantics == true) {
          if (0x1cb < (this->options).version) {
            pcVar7 = "gl_DrawID";
            break;
          }
          ::std::__cxx11::string::string
                    ((string *)&local_38,"GL_ARB_shader_draw_parameters",&local_39);
          require_extension_internal(this,&local_38);
        }
        else {
          ::std::__cxx11::string::string
                    ((string *)&local_38,"GL_ARB_shader_draw_parameters",&local_39);
          require_extension_internal(this,&local_38);
        }
        ::std::__cxx11::string::~string((string *)&local_38);
        pcVar7 = "gl_DrawIDARB";
        break;
      case BuiltInPrimitiveShadingRateKHR:
        if ((this->options).vulkan_semantics == false) {
          pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&local_38,"Can only use PrimitiveShadingRateKHR in Vulkan GLSL.",
                     &local_39);
          CompilerError::CompilerError(pCVar5,&local_38);
          __cxa_throw(pCVar5,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        ::std::__cxx11::string::string((string *)&local_38,"GL_EXT_fragment_shading_rate",&local_39)
        ;
        require_extension_internal(this,&local_38);
        ::std::__cxx11::string::~string((string *)&local_38);
        pcVar7 = "gl_PrimitiveShadingRateEXT";
        break;
      case BuiltInDeviceIndex:
        if ((this->options).vulkan_semantics == false) {
          pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&local_38,"Need Vulkan semantics for device group support.",&local_39
                    );
          CompilerError::CompilerError(pCVar5,&local_38);
          __cxa_throw(pCVar5,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        ::std::__cxx11::string::string((string *)&local_38,"GL_EXT_device_group",&local_39);
        require_extension_internal(this,&local_38);
        ::std::__cxx11::string::~string((string *)&local_38);
        pcVar7 = "gl_DeviceIndex";
        break;
      case BuiltInViewIndex:
        if ((this->options).vulkan_semantics == true) {
          pcVar7 = "gl_ViewIndex";
        }
        else {
          pcVar7 = "gl_ViewID_OVR";
        }
        break;
      case BuiltInShadingRateKHR:
        if ((this->options).vulkan_semantics == false) {
          pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&local_38,"Can only use ShadingRateKHR in Vulkan GLSL.",&local_39);
          CompilerError::CompilerError(pCVar5,&local_38);
          __cxa_throw(pCVar5,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        ::std::__cxx11::string::string((string *)&local_38,"GL_EXT_fragment_shading_rate",&local_39)
        ;
        require_extension_internal(this,&local_38);
        ::std::__cxx11::string::~string((string *)&local_38);
        pcVar7 = "gl_ShadingRateEXT";
        break;
      default:
        ts_1 = &switchD_0025f8e3::switchdataD_003762d0;
        switch(builtin) {
        case BuiltInBaryCoordKHR:
          bVar1 = (this->options).es;
          uVar2 = (this->options).version;
          if ((uVar2 < 0x140 & bVar1) == 1) {
            pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
            ::std::__cxx11::string::string
                      ((string *)&local_38,"gl_BaryCoordEXT requires ESSL 320.",&local_39);
            CompilerError::CompilerError(pCVar5,&local_38);
            __cxa_throw(pCVar5,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
          }
          if (bVar1 == false && uVar2 < 0x1c2) {
            pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
            ::std::__cxx11::string::string
                      ((string *)&local_38,"gl_BaryCoordEXT requires GLSL 450.",&local_39);
            CompilerError::CompilerError(pCVar5,&local_38);
            __cxa_throw(pCVar5,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
          }
          if (this->barycentric_is_nv == true) {
            ::std::__cxx11::string::string
                      ((string *)&local_38,"GL_NV_fragment_shader_barycentric",&local_39);
            require_extension_internal(this,&local_38);
            ::std::__cxx11::string::~string((string *)&local_38);
            pcVar7 = "gl_BaryCoordNV";
          }
          else {
            ::std::__cxx11::string::string
                      ((string *)&local_38,"GL_EXT_fragment_shader_barycentric",&local_39);
            require_extension_internal(this,&local_38);
            ::std::__cxx11::string::~string((string *)&local_38);
            pcVar7 = "gl_BaryCoordEXT";
          }
          break;
        case BuiltInBaryCoordNoPerspKHR:
          bVar1 = (this->options).es;
          uVar2 = (this->options).version;
          if ((uVar2 < 0x140 & bVar1) == 1) {
            pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
            ::std::__cxx11::string::string
                      ((string *)&local_38,"gl_BaryCoordNoPerspEXT requires ESSL 320.",&local_39);
            CompilerError::CompilerError(pCVar5,&local_38);
            __cxa_throw(pCVar5,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
          }
          if (bVar1 == false && uVar2 < 0x1c2) {
            pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
            ::std::__cxx11::string::string
                      ((string *)&local_38,"gl_BaryCoordNoPerspEXT requires GLSL 450.",&local_39);
            CompilerError::CompilerError(pCVar5,&local_38);
            __cxa_throw(pCVar5,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
          }
          if (this->barycentric_is_nv == true) {
            ::std::__cxx11::string::string
                      ((string *)&local_38,"GL_NV_fragment_shader_barycentric",&local_39);
            require_extension_internal(this,&local_38);
            ::std::__cxx11::string::~string((string *)&local_38);
            pcVar7 = "gl_BaryCoordNoPerspNV";
          }
          else {
            ::std::__cxx11::string::string
                      ((string *)&local_38,"GL_EXT_fragment_shader_barycentric",&local_39);
            require_extension_internal(this,&local_38);
            ::std::__cxx11::string::~string((string *)&local_38);
            pcVar7 = "gl_BaryCoordNoPerspEXT";
          }
          break;
        case BuiltInMeshViewCountNV|BuiltInInvocationId:
        case BuiltInMeshViewCountNV|BuiltInLayer:
        case BuiltInMeshViewCountNV|BuiltInViewportIndex:
        case BuiltInMeshViewCountNV|BuiltInTessLevelOuter:
        case BuiltInFragSizeEXT:
        case BuiltInFragInvocationCountEXT:
        case BuiltInPrimitiveTriangleIndicesEXT|BuiltInPointSize:
        case 0x14b2:
          goto switchD_0025f86b_caseD_1145;
        case BuiltInPrimitivePointIndicesEXT:
          pcVar7 = "gl_PrimitivePointIndicesEXT";
          break;
        case BuiltInPrimitiveLineIndicesEXT:
          pcVar7 = "gl_PrimitiveLineIndicesEXT";
          break;
        case BuiltInPrimitiveTriangleIndicesEXT:
          pcVar7 = "gl_PrimitiveTriangleIndicesEXT";
          break;
        case BuiltInCullPrimitiveEXT:
          pcVar7 = "gl_CullPrimitiveEXT";
          break;
        default:
          if (builtin == BuiltInFragStencilRefEXT) {
            if ((this->options).es != false) {
              pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
              ::std::__cxx11::string::string
                        ((string *)&local_38,"Stencil export not supported in GLES.",&local_39);
              CompilerError::CompilerError(pCVar5,&local_38);
              __cxa_throw(pCVar5,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
            }
            ::std::__cxx11::string::string
                      ((string *)&local_38,"GL_ARB_shader_stencil_export",&local_39);
            require_extension_internal(this,&local_38);
            ::std::__cxx11::string::~string((string *)&local_38);
            pcVar7 = "gl_FragStencilRefARB";
          }
          else {
            ts_1 = (uint *)CONCAT44(in_register_0000000c,storage);
            if (builtin != BuiltInFullyCoveredEXT) goto switchD_0025f86b_caseD_1145;
            if ((this->options).es != false) {
              pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
              ::std::__cxx11::string::string
                        ((string *)&local_38,
                         "Need desktop GL to use GL_NV_conservative_raster_underestimation.",
                         &local_39);
              CompilerError::CompilerError(pCVar5,&local_38);
              __cxa_throw(pCVar5,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
            }
            ::std::__cxx11::string::string
                      ((string *)&local_38,"GL_NV_conservative_raster_underestimation",&local_39);
            require_extension_internal(this,&local_38);
            ::std::__cxx11::string::~string((string *)&local_38);
            pcVar7 = "gl_FragFullyCoveredNV";
          }
        }
      }
      goto LAB_0025fac9;
    }
    if (this->ray_tracing_is_khr != false) {
      pcVar7 = pcVar3;
    }
  }
LAB_0025fac9:
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar7,(allocator *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::builtin_to_glsl(BuiltIn builtin, StorageClass storage)
{
	switch (builtin)
	{
	case BuiltInPosition:
		return "gl_Position";
	case BuiltInPointSize:
		return "gl_PointSize";
	case BuiltInClipDistance:
		return "gl_ClipDistance";
	case BuiltInCullDistance:
		return "gl_CullDistance";
	case BuiltInVertexId:
		if (options.vulkan_semantics)
			SPIRV_CROSS_THROW("Cannot implement gl_VertexID in Vulkan GLSL. This shader was created "
			                  "with GL semantics.");
		return "gl_VertexID";
	case BuiltInInstanceId:
		if (options.vulkan_semantics)
		{
			auto model = get_entry_point().model;
			switch (model)
			{
			case spv::ExecutionModelIntersectionKHR:
			case spv::ExecutionModelAnyHitKHR:
			case spv::ExecutionModelClosestHitKHR:
				// gl_InstanceID is allowed in these shaders.
				break;

			default:
				SPIRV_CROSS_THROW("Cannot implement gl_InstanceID in Vulkan GLSL. This shader was "
				                  "created with GL semantics.");
			}
		}
		if (!options.es && options.version < 140)
		{
			require_extension_internal("GL_ARB_draw_instanced");
		}
		return "gl_InstanceID";
	case BuiltInVertexIndex:
		if (options.vulkan_semantics)
			return "gl_VertexIndex";
		else
			return "gl_VertexID"; // gl_VertexID already has the base offset applied.
	case BuiltInInstanceIndex:
		if (options.vulkan_semantics)
			return "gl_InstanceIndex";

		if (!options.es && options.version < 140)
		{
			require_extension_internal("GL_ARB_draw_instanced");
		}

		if (options.vertex.support_nonzero_base_instance)
		{
			if (!options.vulkan_semantics)
			{
				// This is a soft-enable. We will opt-in to using gl_BaseInstanceARB if supported.
				require_extension_internal("GL_ARB_shader_draw_parameters");
			}
			return "(gl_InstanceID + SPIRV_Cross_BaseInstance)"; // ... but not gl_InstanceID.
		}
		else
			return "gl_InstanceID";
	case BuiltInPrimitiveId:
		if (storage == StorageClassInput && get_entry_point().model == ExecutionModelGeometry)
			return "gl_PrimitiveIDIn";
		else
			return "gl_PrimitiveID";
	case BuiltInInvocationId:
		return "gl_InvocationID";
	case BuiltInLayer:
		return "gl_Layer";
	case BuiltInViewportIndex:
		return "gl_ViewportIndex";
	case BuiltInTessLevelOuter:
		return "gl_TessLevelOuter";
	case BuiltInTessLevelInner:
		return "gl_TessLevelInner";
	case BuiltInTessCoord:
		return "gl_TessCoord";
	case BuiltInFragCoord:
		return "gl_FragCoord";
	case BuiltInPointCoord:
		return "gl_PointCoord";
	case BuiltInFrontFacing:
		return "gl_FrontFacing";
	case BuiltInFragDepth:
		return "gl_FragDepth";
	case BuiltInNumWorkgroups:
		return "gl_NumWorkGroups";
	case BuiltInWorkgroupSize:
		return "gl_WorkGroupSize";
	case BuiltInWorkgroupId:
		return "gl_WorkGroupID";
	case BuiltInLocalInvocationId:
		return "gl_LocalInvocationID";
	case BuiltInGlobalInvocationId:
		return "gl_GlobalInvocationID";
	case BuiltInLocalInvocationIndex:
		return "gl_LocalInvocationIndex";
	case BuiltInHelperInvocation:
		return "gl_HelperInvocation";

	case BuiltInBaseVertex:
		if (options.es)
			SPIRV_CROSS_THROW("BaseVertex not supported in ES profile.");

		if (options.vulkan_semantics)
		{
			if (options.version < 460)
			{
				require_extension_internal("GL_ARB_shader_draw_parameters");
				return "gl_BaseVertexARB";
			}
			return "gl_BaseVertex";
		}
		// On regular GL, this is soft-enabled and we emit ifdefs in code.
		require_extension_internal("GL_ARB_shader_draw_parameters");
		return "SPIRV_Cross_BaseVertex";

	case BuiltInBaseInstance:
		if (options.es)
			SPIRV_CROSS_THROW("BaseInstance not supported in ES profile.");

		if (options.vulkan_semantics)
		{
			if (options.version < 460)
			{
				require_extension_internal("GL_ARB_shader_draw_parameters");
				return "gl_BaseInstanceARB";
			}
			return "gl_BaseInstance";
		}
		// On regular GL, this is soft-enabled and we emit ifdefs in code.
		require_extension_internal("GL_ARB_shader_draw_parameters");
		return "SPIRV_Cross_BaseInstance";

	case BuiltInDrawIndex:
		if (options.es)
			SPIRV_CROSS_THROW("DrawIndex not supported in ES profile.");

		if (options.vulkan_semantics)
		{
			if (options.version < 460)
			{
				require_extension_internal("GL_ARB_shader_draw_parameters");
				return "gl_DrawIDARB";
			}
			return "gl_DrawID";
		}
		// On regular GL, this is soft-enabled and we emit ifdefs in code.
		require_extension_internal("GL_ARB_shader_draw_parameters");
		return "gl_DrawIDARB";

	case BuiltInSampleId:
		if (options.es && options.version < 320)
			require_extension_internal("GL_OES_sample_variables");
		if (!options.es && options.version < 400)
			SPIRV_CROSS_THROW("gl_SampleID not supported before GLSL 400.");
		return "gl_SampleID";

	case BuiltInSampleMask:
		if (options.es && options.version < 320)
			require_extension_internal("GL_OES_sample_variables");
		if (!options.es && options.version < 400)
			SPIRV_CROSS_THROW("gl_SampleMask/gl_SampleMaskIn not supported before GLSL 400.");

		if (storage == StorageClassInput)
			return "gl_SampleMaskIn";
		else
			return "gl_SampleMask";

	case BuiltInSamplePosition:
		if (options.es && options.version < 320)
			require_extension_internal("GL_OES_sample_variables");
		if (!options.es && options.version < 400)
			SPIRV_CROSS_THROW("gl_SamplePosition not supported before GLSL 400.");
		return "gl_SamplePosition";

	case BuiltInViewIndex:
		if (options.vulkan_semantics)
			return "gl_ViewIndex";
		else
			return "gl_ViewID_OVR";

	case BuiltInNumSubgroups:
		request_subgroup_feature(ShaderSubgroupSupportHelper::NumSubgroups);
		return "gl_NumSubgroups";

	case BuiltInSubgroupId:
		request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupID);
		return "gl_SubgroupID";

	case BuiltInSubgroupSize:
		request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupSize);
		return "gl_SubgroupSize";

	case BuiltInSubgroupLocalInvocationId:
		request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupInvocationID);
		return "gl_SubgroupInvocationID";

	case BuiltInSubgroupEqMask:
		request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupMask);
		return "gl_SubgroupEqMask";

	case BuiltInSubgroupGeMask:
		request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupMask);
		return "gl_SubgroupGeMask";

	case BuiltInSubgroupGtMask:
		request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupMask);
		return "gl_SubgroupGtMask";

	case BuiltInSubgroupLeMask:
		request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupMask);
		return "gl_SubgroupLeMask";

	case BuiltInSubgroupLtMask:
		request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupMask);
		return "gl_SubgroupLtMask";

	case BuiltInLaunchIdKHR:
		return ray_tracing_is_khr ? "gl_LaunchIDEXT" : "gl_LaunchIDNV";
	case BuiltInLaunchSizeKHR:
		return ray_tracing_is_khr ? "gl_LaunchSizeEXT" : "gl_LaunchSizeNV";
	case BuiltInWorldRayOriginKHR:
		return ray_tracing_is_khr ? "gl_WorldRayOriginEXT" : "gl_WorldRayOriginNV";
	case BuiltInWorldRayDirectionKHR:
		return ray_tracing_is_khr ? "gl_WorldRayDirectionEXT" : "gl_WorldRayDirectionNV";
	case BuiltInObjectRayOriginKHR:
		return ray_tracing_is_khr ? "gl_ObjectRayOriginEXT" : "gl_ObjectRayOriginNV";
	case BuiltInObjectRayDirectionKHR:
		return ray_tracing_is_khr ? "gl_ObjectRayDirectionEXT" : "gl_ObjectRayDirectionNV";
	case BuiltInRayTminKHR:
		return ray_tracing_is_khr ? "gl_RayTminEXT" : "gl_RayTminNV";
	case BuiltInRayTmaxKHR:
		return ray_tracing_is_khr ? "gl_RayTmaxEXT" : "gl_RayTmaxNV";
	case BuiltInInstanceCustomIndexKHR:
		return ray_tracing_is_khr ? "gl_InstanceCustomIndexEXT" : "gl_InstanceCustomIndexNV";
	case BuiltInObjectToWorldKHR:
		return ray_tracing_is_khr ? "gl_ObjectToWorldEXT" : "gl_ObjectToWorldNV";
	case BuiltInWorldToObjectKHR:
		return ray_tracing_is_khr ? "gl_WorldToObjectEXT" : "gl_WorldToObjectNV";
	case BuiltInHitTNV:
		// gl_HitTEXT is an alias of RayTMax in KHR.
		return "gl_HitTNV";
	case BuiltInHitKindKHR:
		return ray_tracing_is_khr ? "gl_HitKindEXT" : "gl_HitKindNV";
	case BuiltInIncomingRayFlagsKHR:
		return ray_tracing_is_khr ? "gl_IncomingRayFlagsEXT" : "gl_IncomingRayFlagsNV";

	case BuiltInBaryCoordKHR:
	{
		if (options.es && options.version < 320)
			SPIRV_CROSS_THROW("gl_BaryCoordEXT requires ESSL 320.");
		else if (!options.es && options.version < 450)
			SPIRV_CROSS_THROW("gl_BaryCoordEXT requires GLSL 450.");

		if (barycentric_is_nv)
		{
			require_extension_internal("GL_NV_fragment_shader_barycentric");
			return "gl_BaryCoordNV";
		}
		else
		{
			require_extension_internal("GL_EXT_fragment_shader_barycentric");
			return "gl_BaryCoordEXT";
		}
	}

	case BuiltInBaryCoordNoPerspNV:
	{
		if (options.es && options.version < 320)
			SPIRV_CROSS_THROW("gl_BaryCoordNoPerspEXT requires ESSL 320.");
		else if (!options.es && options.version < 450)
			SPIRV_CROSS_THROW("gl_BaryCoordNoPerspEXT requires GLSL 450.");

		if (barycentric_is_nv)
		{
			require_extension_internal("GL_NV_fragment_shader_barycentric");
			return "gl_BaryCoordNoPerspNV";
		}
		else
		{
			require_extension_internal("GL_EXT_fragment_shader_barycentric");
			return "gl_BaryCoordNoPerspEXT";
		}
	}

	case BuiltInFragStencilRefEXT:
	{
		if (!options.es)
		{
			require_extension_internal("GL_ARB_shader_stencil_export");
			return "gl_FragStencilRefARB";
		}
		else
			SPIRV_CROSS_THROW("Stencil export not supported in GLES.");
	}

	case BuiltInPrimitiveShadingRateKHR:
	{
		if (!options.vulkan_semantics)
			SPIRV_CROSS_THROW("Can only use PrimitiveShadingRateKHR in Vulkan GLSL.");
		require_extension_internal("GL_EXT_fragment_shading_rate");
		return "gl_PrimitiveShadingRateEXT";
	}

	case BuiltInShadingRateKHR:
	{
		if (!options.vulkan_semantics)
			SPIRV_CROSS_THROW("Can only use ShadingRateKHR in Vulkan GLSL.");
		require_extension_internal("GL_EXT_fragment_shading_rate");
		return "gl_ShadingRateEXT";
	}

	case BuiltInDeviceIndex:
		if (!options.vulkan_semantics)
			SPIRV_CROSS_THROW("Need Vulkan semantics for device group support.");
		require_extension_internal("GL_EXT_device_group");
		return "gl_DeviceIndex";

	case BuiltInFullyCoveredEXT:
		if (!options.es)
			require_extension_internal("GL_NV_conservative_raster_underestimation");
		else
			SPIRV_CROSS_THROW("Need desktop GL to use GL_NV_conservative_raster_underestimation.");
		return "gl_FragFullyCoveredNV";

	case BuiltInPrimitiveTriangleIndicesEXT:
		return "gl_PrimitiveTriangleIndicesEXT";
	case BuiltInPrimitiveLineIndicesEXT:
		return "gl_PrimitiveLineIndicesEXT";
	case BuiltInPrimitivePointIndicesEXT:
		return "gl_PrimitivePointIndicesEXT";
	case BuiltInCullPrimitiveEXT:
		return "gl_CullPrimitiveEXT";

	default:
		return join("gl_BuiltIn_", convert_to_string(builtin));
	}
}